

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::
Section9InvalidSelfIssuedrequireExplicitPolicyTest7<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section9InvalidSelfIssuedrequireExplicitPolicyTest7
          (Section9InvalidSelfIssuedrequireExplicitPolicyTest7<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section9InvalidSelfIssuedrequireExplicitPolicyTest7<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~Section9InvalidSelfIssuedrequireExplicitPolicyTest7(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest09RequireExplicitPolicy,
                     Section9InvalidSelfIssuedrequireExplicitPolicyTest7) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "requireExplicitPolicy2CACert",
                               "requireExplicitPolicy2SelfIssuedCACert",
                               "requireExplicitPolicy2subCACert",
                               "InvalidSelfIssuedrequireExplicitPolicyTest7EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "requireExplicitPolicy2CACRL",
                              "requireExplicitPolicy2subCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.9.7";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}